

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O3

type duckdb::ParquetWriter::DuckDBTypeToParquetType(LogicalType *duckdb_type)

{
  bool bVar1;
  NotImplementedException *this;
  type result;
  type local_64;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = TryGetParquetType(duckdb_type,(optional_ptr<duckdb_parquet::Type::type,_true>)&local_64);
  if (bVar1) {
    return local_64;
  }
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Unimplemented type for Parquet \"%s\"","");
  duckdb::LogicalType::ToString_abi_cxx11_();
  NotImplementedException::NotImplementedException<std::__cxx11::string>(this,&local_60,&local_40);
  __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Type::type ParquetWriter::DuckDBTypeToParquetType(const LogicalType &duckdb_type) {
	Type::type result;
	if (TryGetParquetType(duckdb_type, &result)) {
		return result;
	}
	throw NotImplementedException("Unimplemented type for Parquet \"%s\"", duckdb_type.ToString());
}